

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O0

iterator __thiscall
QVLABase<QAbstractButton_*>::erase
          (QVLABase<QAbstractButton_*> *this,const_iterator abegin,const_iterator aend)

{
  const_iterator ppQVar1;
  long lVar2;
  long lVar3;
  QAbstractButton **ppQVar4;
  QAbstractButton **ppQVar5;
  size_type sVar6;
  long in_RDX;
  long in_RSI;
  QVLABaseBase *in_RDI;
  qsizetype n;
  qsizetype l;
  qsizetype f;
  QAbstractButton **in_stack_ffffffffffffff98;
  QAbstractButton **in_stack_ffffffffffffffa0;
  QAbstractButton **local_8;
  
  ppQVar1 = cbegin((QVLABase<QAbstractButton_*> *)0x6756b0);
  lVar2 = in_RSI - (long)ppQVar1 >> 3;
  ppQVar1 = cbegin((QVLABase<QAbstractButton_*> *)0x6756d8);
  lVar3 = in_RDX - (long)ppQVar1 >> 3;
  if (lVar3 - lVar2 == 0) {
    local_8 = data((QVLABase<QAbstractButton_*> *)in_RDI);
  }
  else {
    std::destroy<QAbstractButton*const*>(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    ppQVar4 = data((QVLABase<QAbstractButton_*> *)in_RDI);
    ppQVar4 = ppQVar4 + lVar2;
    ppQVar5 = data((QVLABase<QAbstractButton_*> *)in_RDI);
    sVar6 = QVLABaseBase::size(in_RDI);
    memmove(ppQVar4,ppQVar5 + lVar3,(sVar6 - lVar3) * 8);
    in_RDI->s = in_RDI->s - (lVar3 - lVar2);
    local_8 = data((QVLABase<QAbstractButton_*> *)in_RDI);
  }
  local_8 = local_8 + lVar2;
  return local_8;
}

Assistant:

Q_OUTOFLINE_TEMPLATE auto QVLABase<T>::erase(const_iterator abegin, const_iterator aend) -> iterator
{
    Q_ASSERT_X(isValidIterator(abegin), "QVarLengthArray::erase", "The specified const_iterator argument 'abegin' is invalid");
    Q_ASSERT_X(isValidIterator(aend), "QVarLengthArray::erase", "The specified const_iterator argument 'aend' is invalid");

    qsizetype f = qsizetype(abegin - cbegin());
    qsizetype l = qsizetype(aend - cbegin());
    qsizetype n = l - f;

    if (n == 0) // avoid UB in std::move() below
        return data() + f;

    Q_ASSERT(n > 0); // aend must be reachable from abegin

    if constexpr (!QTypeInfo<T>::isRelocatable) {
        std::move(begin() + l, end(), QT_MAKE_CHECKED_ARRAY_ITERATOR(begin() + f, size() - f));
        std::destroy(end() - n, end());
    } else {
        std::destroy(abegin, aend);
        memmove(static_cast<void *>(data() + f), static_cast<const void *>(data() + l), (size() - l) * sizeof(T));
    }
    this->s -= n;
    return data() + f;
}